

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

bool __thiscall
glcts::ShaderBitfieldOperationCaseBinaryUint::test
          (ShaderBitfieldOperationCaseBinaryUint *this,Data *data)

{
  GLuint *pGVar1;
  GLuint GVar2;
  bool bVar3;
  long lVar4;
  GLfloat local_2c;
  
  bVar3 = this->m_components < 1;
  if (0 < this->m_components) {
    local_2c = 0.0;
    GVar2 = (*this->m_func)(data->inUvec4[0],data->in2Uvec4[0],(GLuint *)&local_2c);
    if (data->outUvec4[0] == GVar2) {
      lVar4 = 1;
      do {
        if (data->outVec4[lVar4 + 3] != local_2c) {
          return bVar3;
        }
        bVar3 = this->m_components <= (int)lVar4;
        if (this->m_components <= (int)lVar4) {
          return bVar3;
        }
        local_2c = 0.0;
        GVar2 = (*this->m_func)(data->inUvec4[lVar4],data->in2Uvec4[lVar4],(GLuint *)&local_2c);
        pGVar1 = data->outUvec4 + lVar4;
        lVar4 = lVar4 + 1;
      } while (*pGVar1 == GVar2);
    }
  }
  return bVar3;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected2 = 0;
			GLuint expected  = m_func(data->inUvec4[i], data->in2Uvec4[i], expected2);
			if (data->outUvec4[i] != expected || data->out2Uvec4[i] != expected2)
			{
				return false;
			}
		}
		return true;
	}